

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O2

bool glu::contextSupports(ContextType ctxType,ApiType requiredApiType)

{
  bool bVar1;
  
  switch((uint)ctxType.super_ApiType.m_bits >> 8 & 3) {
  case 0:
    if ((requiredApiType.m_bits & 0x300) == 0) {
LAB_008983cf:
      bVar1 = versionGreaterOrEqual(ctxType.super_ApiType.m_bits & 0x3ff,requiredApiType);
      return bVar1;
    }
    break;
  case 1:
    if (((uint)ctxType.super_ApiType.m_bits >> 0xc & 1) != 0) {
      return ((uint)ctxType.super_ApiType.m_bits & 0x3ff) == requiredApiType.m_bits;
    }
    if ((requiredApiType.m_bits & 0x300) == 0x100) goto LAB_008983cf;
    break;
  case 2:
    if ((requiredApiType.m_bits >> 8 & 3) - 1 < 2) goto LAB_008983cf;
  }
  return false;
}

Assistant:

bool contextSupports (ContextType ctxType, ApiType requiredApiType)
{
	// \todo [2014-10-06 pyry] Check exact forward-compatible restrictions.
	const bool forwardCompatible = (ctxType.getFlags() & CONTEXT_FORWARD_COMPATIBLE) != 0;

	if (isContextTypeES(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return requiredApiType.getProfile() == PROFILE_ES &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCore(ctxType))
	{
		if (forwardCompatible)
			return ctxType.getAPI() == requiredApiType;
		else
			return requiredApiType.getProfile() == PROFILE_CORE &&
				   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCompatibility(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return (requiredApiType.getProfile() == PROFILE_CORE || requiredApiType.getProfile() == PROFILE_COMPATIBILITY) &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}